

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O1

void global_motion_estimation(AV1_COMP *cpi)

{
  int iVar1;
  int segment_map_w;
  int segment_map_h;
  uint8_t *segment_map;
  aom_internal_error_info *error_info;
  long lVar2;
  int frame;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar2 = 0;
  do {
    iVar1 = (cpi->gm_info).num_ref_frames[lVar2];
    if (0 < iVar1) {
      segment_map = (cpi->td).gm_data.segment_map;
      segment_map_w = (cpi->gm_info).segment_map_w;
      segment_map_h = (cpi->gm_info).segment_map_h;
      error_info = (cpi->td).mb.e_mbd.error_info;
      uVar4 = 0;
      do {
        frame = (int)(cpi->gm_info).reference_frames[lVar2][uVar4].frame;
        av1_compute_gm_for_valid_ref_frames
                  (cpi,error_info,(cpi->gm_info).ref_buf,frame,(cpi->td).gm_data.motion_models,
                   segment_map,segment_map_w,segment_map_h);
        if (((cpi->sf).gm_sf.prune_ref_frame_for_gm_search != 0) &&
           ((cpi->common).global_motion[frame].wmtype < 2)) break;
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while ((int)uVar3 < iVar1);
    }
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + 1;
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

static inline void global_motion_estimation(AV1_COMP *cpi) {
  GlobalMotionInfo *const gm_info = &cpi->gm_info;
  GlobalMotionData *gm_data = &cpi->td.gm_data;

  // Compute global motion w.r.t. past reference frames and future reference
  // frames
  for (int dir = 0; dir < MAX_DIRECTIONS; dir++) {
    if (gm_info->num_ref_frames[dir] > 0)
      compute_global_motion_for_references(
          cpi, gm_info->ref_buf, gm_info->reference_frames[dir],
          gm_info->num_ref_frames[dir], gm_data->motion_models,
          gm_data->segment_map, gm_info->segment_map_w, gm_info->segment_map_h);
  }
}